

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

int __thiscall despot::HierarchyCPT::ParentSize(HierarchyCPT *this)

{
  int iVar1;
  size_type sVar2;
  const_reference ppNVar3;
  int local_18;
  int local_14;
  int i;
  int size;
  HierarchyCPT *this_local;
  
  local_14 = 1;
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size
                      (&(this->super_CPT).super_Function.parents_);
    if (sVar2 <= (ulong)(long)local_18) break;
    ppNVar3 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (&(this->super_CPT).super_Function.parents_,(long)local_18);
    iVar1 = Variable::Size(&(*ppNVar3)->super_Variable);
    local_14 = iVar1 * local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int HierarchyCPT::ParentSize() const {
	int size = 1;
	for (int i = 0; i < parents_.size(); i++)
		size *= parents_[i]->Size();
	return size;
}